

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGNode.h
# Opt level: O3

void __thiscall dg::sdg::DGNodeArtificial::~DGNodeArtificial(DGNodeArtificial *this)

{
  (this->super_DGNode).super_DepDGElement.super_DGElement._vptr_DGElement =
       (_func_int **)&PTR__DepDGElement_00104d40;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._rev_control_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._rev_control_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._rev_memory_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._rev_memory_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._rev_use_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._rev_use_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._control_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._control_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._memory_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._memory_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  std::
  _Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
  ::_M_erase((_Rb_tree<dg::sdg::DepDGElement_*,_dg::sdg::DepDGElement_*,_std::_Identity<dg::sdg::DepDGElement_*>,_std::less<dg::sdg::DepDGElement_*>,_std::allocator<dg::sdg::DepDGElement_*>_>
              *)&(this->super_DGNode).super_DepDGElement._use_deps,
             *(_Link_type *)
              ((long)&(this->super_DGNode).super_DepDGElement._use_deps.
                      super_DGContainer<dg::sdg::DepDGElement_*,_4U>.container._M_t._M_impl + 0x10))
  ;
  operator_delete(this,0x140);
  return;
}

Assistant:

DGNodeArtificial(DependenceGraph &g)
            : DGNode(g, DGElementType::ND_ARTIFICIAL) {}